

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O2

int __thiscall lsvm::hashset::remove(hashset *this,char *__filename)

{
  uint uVar1;
  hash_fp p_Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  equals_fp p_Var5;
  uint uVar6;
  equals_fp *pp_Var7;
  equals_fp *pp_Var8;
  equals_fp *pp_Var9;
  uint uVar10;
  
  p_Var5 = (equals_fp)(*this->hash)(__filename);
  pp_Var8 = &this[1].equals + ((uint)this->bits & (uint)p_Var5);
  do {
    while( true ) {
      pp_Var8 = (equals_fp *)*pp_Var8;
      if (pp_Var8 == (equals_fp *)0x0) {
        return 0;
      }
      uVar1 = (&primes)[*(uint *)((long)pp_Var8 + 0xc)];
      uVar6 = (this->range * uVar1) / 100000;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = p_Var5;
      pp_Var7 = pp_Var8 + SUB168(auVar3 % ZEXT416(uVar1),0) * 2 + 2;
      if (uVar1 <= uVar6) {
        uVar6 = uVar1 - 1;
      }
      uVar10 = uVar6 + SUB164(auVar3 % ZEXT416(uVar1),0);
      if (uVar10 < uVar1) break;
      pp_Var9 = pp_Var8 + 2;
      for (; pp_Var7 <= pp_Var9 + (ulong)(uVar1 - 1) * 2; pp_Var7 = pp_Var7 + 2) {
        if (((*pp_Var7 == p_Var5) && (pp_Var7[1] != (equals_fp)0x0)) &&
           (bVar4 = (*this->equals)(__filename,pp_Var7[1]), bVar4)) goto LAB_001062fb;
      }
      for (pp_Var7 = pp_Var9; pp_Var7 <= pp_Var9 + (ulong)(uVar10 - uVar1) * 2;
          pp_Var7 = pp_Var7 + 2) {
        if (((*pp_Var7 == p_Var5) && (pp_Var7[1] != (equals_fp)0x0)) &&
           (bVar4 = (*this->equals)(__filename,pp_Var7[1]), bVar4)) goto LAB_001062fb;
      }
    }
    pp_Var9 = pp_Var7 + (ulong)uVar6 * 2;
    for (; pp_Var7 <= pp_Var9; pp_Var7 = pp_Var7 + 2) {
      if (((*pp_Var7 == p_Var5) && (pp_Var7[1] != (equals_fp)0x0)) &&
         (bVar4 = (*this->equals)(__filename,pp_Var7[1]), bVar4)) {
LAB_001062fb:
        p_Var2 = (hash_fp)pp_Var7[1];
        *pp_Var7 = (equals_fp)0x0;
        pp_Var7[1] = (equals_fp)0x0;
        *(int *)(pp_Var8 + 1) = *(int *)(pp_Var8 + 1) + -1;
        this->count = this->count - 1;
        return (int)p_Var2;
      }
    }
  } while( true );
}

Assistant:

void* remove(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *(partition(h,bit));

    // find key in a bucket using open address
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    return null;
}